

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_console.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int playersNum;
  char *addr;
  long lVar2;
  char *name;
  char *pcVar3;
  ComplexBot complexBot;
  Runner runner;
  ComplexBot CStack_4e8;
  Runner local_3a0;
  
  if (argc < 2) {
    playersNum = 4;
    pcVar3 = "wg-forge3";
    iVar1 = 0x1bb;
    addr = "wgforge-srv.wargaming.net";
    name = "Tiger";
LAB_0013c58c:
    tiger::trains::Runner::Runner(&local_3a0,name,addr,iVar1,pcVar3,playersNum);
    tiger::trains::ai::ComplexBot::ComplexBot(&CStack_4e8);
    tiger::trains::Runner::setBot(&local_3a0,&CStack_4e8.super_IBot);
    tiger::trains::Runner::run(&local_3a0);
    tiger::trains::ai::ComplexBot::~ComplexBot(&CStack_4e8);
    local_3a0._vptr_Runner = (_func_int **)&PTR__Runner_00183120;
    tiger::trains::world::World::~World(&local_3a0.world);
    iVar1 = 0;
  }
  else {
    if (argc == 6) {
      iVar1 = atoi(argv[3]);
      if (iVar1 == 0) {
        pcVar3 = "Invalid port.";
        lVar2 = 0xd;
      }
      else {
        playersNum = atoi(argv[5]);
        if (playersNum != 0) {
          pcVar3 = argv[4];
          name = argv[1];
          addr = argv[2];
          goto LAB_0013c58c;
        }
        pcVar3 = "Invalid players num.";
        lVar2 = 0x14;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Wrong number of arguments.",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      pcVar3 = "Usage:  console (login) (host) (port) (game) (playersNum)";
      lVar2 = 0x39;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

INITIALIZE_EASYLOGGINGPP


int main(int argc, char *argv[]){

    const char * login = "Tiger";
    const char * host = "wgforge-srv.wargaming.net";
    int port = 443;
    const char *gameName = "wg-forge3";
    int playersNum = 4;

    if (argc > 1){
        if (argc != 6){
            std::cerr << "Wrong number of arguments." << std::endl;
            std::cerr << "Usage:  console (login) (host) (port) (game) (playersNum)" << std::endl;
            return -1;
        }

        login = argv[1];
        host = argv[2];
        port = atoi(argv[3]);
        gameName = argv[4];
        playersNum = atoi(argv[5]);

        if (!port){
            std::cerr << "Invalid port." << std::endl;
            return -1;
        }

        if (!playersNum)
        {
            std::cerr << "Invalid players num." << std::endl;
            return -1;
        }
    }

    Runner runner(login, host, port, gameName, playersNum);
    ai::ComplexBot complexBot;
    runner.setBot(&complexBot);

    runner.run();

    return 0;
}